

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  dir_tree_s *pdVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  dir_tree_t *trees;
  int *piVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  file_entry_t *pfVar13;
  byte *pbVar14;
  int iVar15;
  stat zipstat;
  stat local_b0;
  
  if (1 < argc) {
    iVar9 = 1;
    iVar15 = 0;
    uVar11 = 1;
    bVar4 = false;
LAB_001049a5:
    pcVar1 = argv[uVar11];
    if (*pcVar1 != '-') {
      lVar7 = (long)iVar9;
      iVar9 = iVar9 + 1;
      argv[lVar7] = pcVar1;
      goto LAB_00104a26;
    }
    bVar6 = pcVar1[1];
    if ((bVar6 != 0x2d) || (pcVar1[2] != '\0')) {
      pbVar14 = (byte *)(pcVar1 + 2);
      do {
        if (bVar6 < 0x71) {
          if (bVar6 == 100) {
            DeflateOnly = 1;
          }
          else {
            if (bVar6 != 0x66) goto LAB_00104a1e;
            bVar4 = true;
          }
        }
        else if (bVar6 == 0x71) {
          Quiet = 1;
        }
        else {
          if (bVar6 != 0x75) goto LAB_00104ad0;
          iVar15 = 1;
        }
        bVar6 = *pbVar14;
        pbVar14 = pbVar14 + 1;
      } while( true );
    }
    goto LAB_00104a45;
  }
  bVar4 = false;
  uVar11 = 1;
  iVar9 = 1;
  iVar15 = 0;
LAB_00104a45:
  uVar10 = (uint)uVar11;
  if ((int)uVar10 <= argc) goto LAB_00104a49;
LAB_00104a71:
  if ((int)((argc - uVar10) + iVar9) < 3) {
    main_cold_5();
    return 1;
  }
  trees = add_dirs(argv + 2);
  if (no_mem == '\x01') {
    main_cold_4();
    return 1;
  }
  iVar9 = stat(argv[1],&local_b0);
  if (iVar9 == 0) {
    iVar9 = iVar15;
    if (!bVar4) {
      bVar5 = false;
      for (pdVar2 = trees; pdVar2 != (dir_tree_t *)0x0; pdVar2 = pdVar2->next) {
        pfVar13 = (file_entry_t *)&pdVar2->files;
        do {
          pfVar13 = pfVar13->next;
          if (pfVar13 == (file_entry_t *)0x0) goto LAB_00104b07;
        } while (pfVar13->time_write <= local_b0.st_mtim.tv_sec);
        bVar5 = true;
LAB_00104b07:
      }
      goto LAB_00104b0f;
    }
  }
  else {
    piVar8 = __errno_location();
    iVar9 = 0;
    if (*piVar8 != 2) {
      main_cold_2();
      bVar5 = bVar4;
LAB_00104b0f:
      iVar9 = iVar15;
      if (!bVar4 && !bVar5) goto joined_r0x00104b24;
    }
  }
  write_zip(argv[1],trees,iVar9);
joined_r0x00104b24:
  while (trees != (dir_tree_t *)0x0) {
    pdVar2 = trees->next;
    free_dir_tree(trees);
    trees = pdVar2;
  }
  if (no_mem == '\x01') {
    main_cold_3();
    return 1;
  }
  return 0;
LAB_00104a1e:
  if (bVar6 != 0) {
LAB_00104ad0:
    main_cold_1();
    return 1;
  }
LAB_00104a26:
  uVar11 = uVar11 + 1;
  if (uVar11 == (uint)argc) goto code_r0x00104a32;
  goto LAB_001049a5;
code_r0x00104a32:
  uVar11 = (ulong)(uint)argc;
LAB_00104a49:
  uVar12 = uVar11 & 0xffffffff;
  lVar7 = 0;
  do {
    argv[iVar9 + lVar7] = argv[uVar12 + lVar7];
    iVar3 = (int)uVar11;
    uVar10 = iVar3 + 1;
    uVar11 = (ulong)uVar10;
    lVar7 = lVar7 + 1;
  } while (iVar3 < argc);
  iVar9 = iVar9 + (int)lVar7;
  goto LAB_00104a71;
}

Assistant:

int main (int argc, char **argv)
{
	dir_tree_t *tree, *trees;
	file_entry_t *file;
	struct stat zipstat;
	int needwrite;
	int i, j, k;
	int force = 0;
	int update = 0;

	// Find options. Options are removed from the array.
	for (i = k = 1; i < argc; ++i)
	{
		if (argv[i][0] == '-')
		{
			if (argv[i][1] == '-')
			{
				if (argv[i][2] == '\0')
				{ // -- terminates option handling for the rest of the command line
					break;
				}
			}
			for (j = 1; argv[i][j] != '\0'; ++j)
			{
				if (argv[i][j] == 'f')
				{
					force = 1;
				}
				else if (argv[i][j] == 'd')
				{
					DeflateOnly = 1;
				}
				else if (argv[i][j] == 'u')
				{
					update = 1;
				}
				else if (argv[i][j] == 'q')
				{
					Quiet = 1;
				}
				else
				{
					fprintf(stderr, "Unknown option '%c'\n", argv[i][j]);
					print_usage(argv[0]);
					return 1;
				}
			}
		}
		else
		{
			argv[k++] = argv[i];
		}
	}
	for (; i <= argc; ++i)
	{
		argv[k++] = argv[i];
	}
	argc -= i - k;

	if (argc < 3)
	{
		print_usage(argv[0]);
		return 1;
	}

	trees = add_dirs(&argv[2]);
	if (no_mem)
	{
		free_dir_trees(trees);
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}

	needwrite = force;
	if (stat(argv[1], &zipstat) != 0)
	{
		if (errno == ENOENT)
		{
			needwrite = 1;
			update = 0;		// Can't update what's not there.
		}
		else
		{
			fprintf(stderr, "Could not stat %s: %s\n", argv[1], strerror(errno));
		}
	}
	else if (!needwrite)
	{
		// Check the files in each tree. If any one of them was modified more
		// recently than the zip, then it needs to be recreated.
		for (tree = trees; tree != NULL; tree = tree->next)
		{
			for (file = tree->files; file != NULL; file = file->next)
			{
				if (file->time_write > zipstat.st_mtime)
				{
					needwrite = 1;
					break;
				}
			}
		}
	}
	if (force || needwrite)
	{
		write_zip(argv[1], trees, update);
	}
	free_dir_trees(trees);
	if (no_mem)
	{
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}
	return 0;
}